

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O1

int decompress_onepass(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  _func_void_j_decompress_ptr **pp_Var1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  int iVar4;
  uint uVar5;
  jpeg_d_coef_controller *pjVar6;
  jpeg_entropy_decoder *pjVar7;
  jpeg_component_info *pjVar8;
  inverse_DCT_method_ptr p_Var9;
  boolean bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  JDIMENSION JVar16;
  JSAMPARRAY ppJVar17;
  ulong uVar18;
  ulong uVar19;
  int local_88;
  
  pjVar6 = cinfo->coef;
  iVar15 = *(int *)((long)&pjVar6[1].start_input_pass + 4);
  if (iVar15 < *(int *)&pjVar6[1].consume_data) {
    JVar2 = cinfo->total_iMCU_rows;
    uVar14 = cinfo->MCUs_per_row - 1;
    pp_Var1 = &pjVar6[1].start_output_pass;
    do {
      for (uVar11 = *(uint *)&pjVar6[1].start_input_pass; uVar11 <= uVar14; uVar11 = uVar11 + 1) {
        jzero_far(*pp_Var1,(long)cinfo->blocks_in_MCU << 7);
        pjVar7 = cinfo->entropy;
        if (pjVar7->insufficient_data == 0) {
          cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
        }
        bVar10 = (*pjVar7->decode_mcu)(cinfo,(JBLOCKROW *)pp_Var1);
        if (bVar10 == 0) {
          *(int *)((long)&pjVar6[1].start_input_pass + 4) = iVar15;
          *(uint *)&pjVar6[1].start_input_pass = uVar11;
          return 0;
        }
        if (((cinfo->master->first_iMCU_col <= uVar11) && (uVar11 <= cinfo->master->last_iMCU_col))
           && (0 < cinfo->comps_in_scan)) {
          lVar13 = 0;
          local_88 = 0;
          do {
            pjVar8 = cinfo->cur_comp_info[lVar13];
            if (pjVar8->component_needed == 0) {
              local_88 = local_88 + pjVar8->MCU_blocks;
            }
            else if (0 < pjVar8->MCU_height) {
              p_Var9 = cinfo->idct->inverse_DCT[pjVar8->component_index];
              JVar3 = cinfo->master->first_iMCU_col;
              iVar4 = pjVar8->MCU_sample_width;
              uVar5 = (&pjVar8->MCU_width)[(ulong)(uVar14 <= uVar11) * 4];
              ppJVar17 = output_buf[pjVar8->component_index] +
                         (long)iVar15 * (long)pjVar8->DCT_scaled_size;
              uVar18 = 1;
              if (1 < (int)uVar5) {
                uVar18 = (ulong)uVar5;
              }
              iVar12 = 0;
              do {
                if (((cinfo->input_iMCU_row < JVar2 - 1) ||
                    (iVar15 + iVar12 < pjVar8->last_row_height)) && (0 < (int)uVar5)) {
                  uVar19 = 0;
                  JVar16 = (uVar11 - JVar3) * iVar4;
                  do {
                    (*p_Var9)(cinfo,pjVar8,(JCOEFPTR)pp_Var1[(long)local_88 + uVar19],ppJVar17,
                              JVar16);
                    JVar16 = JVar16 + pjVar8->DCT_scaled_size;
                    uVar19 = uVar19 + 1;
                  } while (uVar18 != uVar19);
                }
                local_88 = local_88 + pjVar8->MCU_width;
                ppJVar17 = ppJVar17 + pjVar8->DCT_scaled_size;
                iVar12 = iVar12 + 1;
              } while (iVar12 < pjVar8->MCU_height);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < cinfo->comps_in_scan);
        }
      }
      *(undefined4 *)&pjVar6[1].start_input_pass = 0;
      iVar15 = iVar15 + 1;
    } while (iVar15 < *(int *)&pjVar6[1].consume_data);
  }
  cinfo->output_iMCU_row = cinfo->output_iMCU_row + 1;
  uVar14 = cinfo->input_iMCU_row + 1;
  cinfo->input_iMCU_row = uVar14;
  if (uVar14 < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    iVar15 = 3;
  }
  else {
    (*cinfo->inputctl->finish_input_pass)(cinfo);
    iVar15 = 4;
  }
  return iVar15;
}

Assistant:

METHODDEF(int)
decompress_onepass(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, useful_width;
  JSAMPARRAY output_ptr;
  JDIMENSION start_col, output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Loop to process as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num <= last_MCU_col;
         MCU_col_num++) {
      /* Try to fetch an MCU.  Entropy decoder expects buffer to be zeroed. */
      jzero_far((void *)coef->MCU_buffer[0],
                (size_t)(cinfo->blocks_in_MCU * sizeof(JBLOCK)));
      if (!cinfo->entropy->insufficient_data)
        cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
      if (!(*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->MCU_ctr = MCU_col_num;
        return JPEG_SUSPENDED;
      }

      /* Only perform the IDCT on blocks that are contained within the desired
       * cropping region.
       */
      if (MCU_col_num >= cinfo->master->first_iMCU_col &&
          MCU_col_num <= cinfo->master->last_iMCU_col) {
        /* Determine where data should go in output_buf and do the IDCT thing.
         * We skip dummy blocks at the right and bottom edges (but blkn gets
         * incremented past them!).  Note the inner loop relies on having
         * allocated the MCU_buffer[] blocks sequentially.
         */
        blkn = 0;               /* index of current DCT block within MCU */
        for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
          compptr = cinfo->cur_comp_info[ci];
          /* Don't bother to IDCT an uninteresting component. */
          if (!compptr->component_needed) {
            blkn += compptr->MCU_blocks;
            continue;
          }
          inverse_DCT = cinfo->idct->inverse_DCT[compptr->component_index];
          useful_width = (MCU_col_num < last_MCU_col) ?
                         compptr->MCU_width : compptr->last_col_width;
          output_ptr = output_buf[compptr->component_index] +
                       yoffset * compptr->_DCT_scaled_size;
          start_col = (MCU_col_num - cinfo->master->first_iMCU_col) *
                      compptr->MCU_sample_width;
          for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
            if (cinfo->input_iMCU_row < last_iMCU_row ||
                yoffset + yindex < compptr->last_row_height) {
              output_col = start_col;
              for (xindex = 0; xindex < useful_width; xindex++) {
                (*inverse_DCT) (cinfo, compptr,
                                (JCOEFPTR)coef->MCU_buffer[blkn + xindex],
                                output_ptr, output_col);
                output_col += compptr->_DCT_scaled_size;
              }
            }
            blkn += compptr->MCU_width;
            output_ptr += compptr->_DCT_scaled_size;
          }
        }
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  cinfo->output_iMCU_row++;
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}